

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_internal.h
# Opt level: O0

h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> * __thiscall
AS_02::h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::FlushIndexPartition
          (h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *this)

{
  ui32_t uVar1;
  int64_t iVar2;
  long in_RSI;
  PartitionPair local_b0;
  undefined1 local_98 [136];
  h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *this_local;
  Result_t *result;
  
  local_98[0x7f] = 0;
  this_local = this;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  uVar1 = MXF::AS02IndexWriterVBR::GetDuration((AS02IndexWriterVBR *)(in_RSI + 0x448));
  if (uVar1 != 0) {
    iVar2 = Kumu::IFileReader::TellPosition((IFileReader *)(in_RSI + 0x10));
    *(int64_t *)(in_RSI + 0x4d0) = iVar2;
    MXF::AS02IndexWriterVBR::WriteToFile
              ((AS02IndexWriterVBR *)local_98,(FileWriter *)(in_RSI + 0x448));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    ASDCP::MXF::RIP::PartitionPair::PartitionPair(&local_b0,0,*(ui64_t *)(in_RSI + 0x4d0));
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)(in_RSI + 0x2e8),&local_b0);
    ASDCP::MXF::RIP::PartitionPair::~PartitionPair(&local_b0);
  }
  return this;
}

Assistant:

Result_t FlushIndexPartition()
      {
          Result_t result = RESULT_OK;
	    if ( this->m_IndexWriter.GetDuration() > 0 )
	    {
	    this->m_IndexWriter.ThisPartition = this->m_File.TellPosition();
	    result = this->m_IndexWriter.WriteToFile(this->m_File);
	    this->m_RIP.PairArray.push_back(RIP::PartitionPair(0, this->m_IndexWriter.ThisPartition));
	    }
          return result;
      }